

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FRandom_*,_FRandom_*>::~TDeletingArray(TDeletingArray<FRandom_*,_FRandom_*> *this)

{
  FRandom *this_00;
  uint uVar1;
  FRandom **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FRandom_*,_FRandom_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FRandom_*,_FRandom_*>::Size(&this->super_TArray<FRandom_*,_FRandom_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FRandom_*,_FRandom_*>::operator[]
                        (&this->super_TArray<FRandom_*,_FRandom_*>,(ulong)local_14);
    if (*ppFVar2 != (FRandom *)0x0) {
      ppFVar2 = TArray<FRandom_*,_FRandom_*>::operator[]
                          (&this->super_TArray<FRandom_*,_FRandom_*>,(ulong)local_14);
      this_00 = *ppFVar2;
      if (this_00 != (FRandom *)0x0) {
        FRandom::~FRandom(this_00);
        operator_delete(this_00,0x70);
      }
    }
  }
  TArray<FRandom_*,_FRandom_*>::~TArray(&this->super_TArray<FRandom_*,_FRandom_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}